

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmbtoken.cc
# Opt level: O0

int dleq_generate(PMBTOKEN_METHOD *method,CBB *cbb,TRUST_TOKEN_ISSUER_KEY *priv,EC_JACOBIAN *T,
                 EC_JACOBIAN *S,EC_JACOBIAN *W,EC_JACOBIAN *Ws,uint8_t private_metadata)

{
  BN_ULONG mask_00;
  int iVar1;
  undefined1 local_2928 [8];
  EC_SCALAR v1;
  EC_SCALAR v0;
  EC_SCALAR u1;
  EC_SCALAR u0;
  EC_SCALAR c1;
  EC_SCALAR c0;
  EC_SCALAR co;
  EC_SCALAR cb_mont;
  EC_SCALAR vb;
  EC_SCALAR ub;
  EC_SCALAR cb;
  EC_SCALAR vs;
  EC_SCALAR us;
  EC_SCALAR cs_mont;
  EC_SCALAR c;
  EC_SCALAR cs;
  EC_AFFINE K11;
  EC_AFFINE K10;
  EC_AFFINE K01;
  EC_AFFINE K00;
  EC_AFFINE affines [10];
  EC_SCALAR vo;
  EC_SCALAR uo;
  EC_SCALAR minus_co;
  EC_SCALAR k1;
  EC_SCALAR k0;
  EC_SCALAR yb;
  EC_SCALAR xb;
  EC_PRECOMP pubo_precomp;
  BN_ULONG mask;
  EC_SCALAR ks1;
  EC_SCALAR ks0;
  EC_JACOBIAN jacobians [10];
  EC_GROUP *group;
  EC_JACOBIAN *W_local;
  EC_JACOBIAN *S_local;
  EC_JACOBIAN *T_local;
  TRUST_TOKEN_ISSUER_KEY *priv_local;
  CBB *cbb_local;
  PMBTOKEN_METHOD *method_local;
  
  jacobians[9].Z.words[8] = (BN_ULONG)method->group;
  iVar1 = ec_random_nonzero_scalar
                    ((EC_GROUP *)jacobians[9].Z.words[8],(EC_SCALAR *)(ks1.words + 8),"");
  if ((((iVar1 == 0) ||
       (iVar1 = ec_random_nonzero_scalar((EC_GROUP *)jacobians[9].Z.words[8],(EC_SCALAR *)&mask,""),
       iVar1 == 0)) ||
      (iVar1 = ec_point_mul_scalar_precomp
                         ((EC_GROUP *)jacobians[9].Z.words[8],
                          (EC_JACOBIAN *)(jacobians[3].Z.words + 8),&method->g_precomp,
                          (EC_SCALAR *)(ks1.words + 8),&method->h_precomp,(EC_SCALAR *)&mask,
                          (EC_PRECOMP *)0x0,(EC_SCALAR *)0x0), iVar1 == 0)) ||
     (iVar1 = ec_point_mul_scalar_batch
                        ((EC_GROUP *)jacobians[9].Z.words[8],
                         (EC_JACOBIAN *)(jacobians[4].Z.words + 8),T,(EC_SCALAR *)(ks1.words + 8),S,
                         (EC_SCALAR *)&mask,(EC_JACOBIAN *)0x0,(EC_SCALAR *)0x0), iVar1 == 0)) {
    return 0;
  }
  mask_00 = -(long)(int)(private_metadata & 1);
  ec_scalar_select((EC_GROUP *)jacobians[9].Z.words[8],(EC_SCALAR *)(yb.words + 8),mask_00,&priv->x1
                   ,&priv->x0);
  ec_scalar_select((EC_GROUP *)jacobians[9].Z.words[8],(EC_SCALAR *)(k0.words + 8),mask_00,&priv->y1
                   ,&priv->y0);
  ec_precomp_select((EC_GROUP *)jacobians[9].Z.words[8],(EC_PRECOMP *)(xb.words + 8),mask_00,
                    &priv->pub0_precomp,&priv->pub1_precomp);
  iVar1 = ec_random_nonzero_scalar
                    ((EC_GROUP *)jacobians[9].Z.words[8],(EC_SCALAR *)(k1.words + 8),"");
  if (((((iVar1 == 0) ||
        (iVar1 = ec_random_nonzero_scalar
                           ((EC_GROUP *)jacobians[9].Z.words[8],(EC_SCALAR *)(minus_co.words + 8),""
                           ), iVar1 == 0)) ||
       ((iVar1 = ec_point_mul_scalar_precomp
                           ((EC_GROUP *)jacobians[9].Z.words[8],
                            (EC_JACOBIAN *)(jacobians[5].Z.words + 8),&method->g_precomp,
                            (EC_SCALAR *)(k1.words + 8),&method->h_precomp,
                            (EC_SCALAR *)(minus_co.words + 8),(EC_PRECOMP *)0x0,(EC_SCALAR *)0x0),
        iVar1 == 0 ||
        ((iVar1 = ec_point_mul_scalar_batch
                            ((EC_GROUP *)jacobians[9].Z.words[8],
                             (EC_JACOBIAN *)(jacobians[6].Z.words + 8),T,(EC_SCALAR *)(k1.words + 8)
                             ,S,(EC_SCALAR *)(minus_co.words + 8),(EC_JACOBIAN *)0x0,
                             (EC_SCALAR *)0x0), iVar1 == 0 ||
         (iVar1 = ec_random_nonzero_scalar
                            ((EC_GROUP *)jacobians[9].Z.words[8],(EC_SCALAR *)(uo.words + 8),""),
         iVar1 == 0)))))) ||
      (iVar1 = ec_random_nonzero_scalar
                         ((EC_GROUP *)jacobians[9].Z.words[8],(EC_SCALAR *)(vo.words + 8),""),
      iVar1 == 0)) ||
     (((iVar1 = ec_random_nonzero_scalar
                          ((EC_GROUP *)jacobians[9].Z.words[8],(EC_SCALAR *)(affines[9].Y.words + 8)
                           ,""), iVar1 == 0 ||
       (iVar1 = ec_point_mul_scalar_precomp
                          ((EC_GROUP *)jacobians[9].Z.words[8],
                           (EC_JACOBIAN *)(jacobians[7].Z.words + 8),&method->g_precomp,
                           (EC_SCALAR *)(vo.words + 8),&method->h_precomp,
                           (EC_SCALAR *)(affines[9].Y.words + 8),(EC_PRECOMP *)(xb.words + 8),
                           (EC_SCALAR *)(uo.words + 8)), iVar1 == 0)) ||
      (iVar1 = ec_point_mul_scalar_batch
                         ((EC_GROUP *)jacobians[9].Z.words[8],
                          (EC_JACOBIAN *)(jacobians[8].Z.words + 8),T,(EC_SCALAR *)(vo.words + 8),S,
                          (EC_SCALAR *)(affines[9].Y.words + 8),W,(EC_SCALAR *)(uo.words + 8)),
      iVar1 == 0)))) {
    return 0;
  }
  memcpy(ks0.words + 8,T,0xd8);
  memcpy(jacobians[0].Z.words + 8,S,0xd8);
  memcpy(jacobians[1].Z.words + 8,W,0xd8);
  memcpy(jacobians[2].Z.words + 8,Ws,0xd8);
  iVar1 = ec_jacobian_to_affine_batch
                    ((EC_GROUP *)jacobians[9].Z.words[8],(EC_AFFINE *)(K00.Y.words + 8),
                     (EC_JACOBIAN *)(ks0.words + 8),10);
  if (iVar1 == 0) {
    return 0;
  }
  ec_affine_select((EC_GROUP *)jacobians[9].Z.words[8],(EC_AFFINE *)(K01.Y.words + 8),mask_00,
                   (EC_AFFINE *)(affines[7].Y.words + 8),(EC_AFFINE *)(affines[5].Y.words + 8));
  ec_affine_select((EC_GROUP *)jacobians[9].Z.words[8],(EC_AFFINE *)(K10.Y.words + 8),mask_00,
                   (EC_AFFINE *)(affines[8].Y.words + 8),(EC_AFFINE *)(affines[6].Y.words + 8));
  ec_affine_select((EC_GROUP *)jacobians[9].Z.words[8],(EC_AFFINE *)(K11.Y.words + 8),mask_00,
                   (EC_AFFINE *)(affines[5].Y.words + 8),(EC_AFFINE *)(affines[7].Y.words + 8));
  ec_affine_select((EC_GROUP *)jacobians[9].Z.words[8],(EC_AFFINE *)(cs.words + 8),mask_00,
                   (EC_AFFINE *)(affines[6].Y.words + 8),(EC_AFFINE *)(affines[8].Y.words + 8));
  iVar1 = hash_c_dleq(method,(EC_SCALAR *)(c.words + 8),&priv->pubs,(EC_AFFINE *)(K00.Y.words + 8),
                      (EC_AFFINE *)(affines[0].Y.words + 8),(EC_AFFINE *)(affines[2].Y.words + 8),
                      (EC_AFFINE *)(affines[3].Y.words + 8),(EC_AFFINE *)(affines[4].Y.words + 8));
  if ((iVar1 == 0) ||
     (iVar1 = hash_c_dleqor(method,(EC_SCALAR *)(cs_mont.words + 8),&priv->pub0,&priv->pub1,
                            (EC_AFFINE *)(K00.Y.words + 8),(EC_AFFINE *)(affines[0].Y.words + 8),
                            (EC_AFFINE *)(affines[1].Y.words + 8),(EC_AFFINE *)(K01.Y.words + 8),
                            (EC_AFFINE *)(K10.Y.words + 8),(EC_AFFINE *)(K11.Y.words + 8),
                            (EC_AFFINE *)(cs.words + 8)), iVar1 == 0)) {
    return 0;
  }
  ec_scalar_to_montgomery
            ((EC_GROUP *)jacobians[9].Z.words[8],(EC_SCALAR *)(us.words + 8),
             (EC_SCALAR *)(c.words + 8));
  ec_scalar_mul_montgomery
            ((EC_GROUP *)jacobians[9].Z.words[8],(EC_SCALAR *)(vs.words + 8),&priv->xs,
             (EC_SCALAR *)(us.words + 8));
  ec_scalar_add((EC_GROUP *)jacobians[9].Z.words[8],(EC_SCALAR *)(vs.words + 8),
                (EC_SCALAR *)(ks1.words + 8),(EC_SCALAR *)(vs.words + 8));
  ec_scalar_mul_montgomery
            ((EC_GROUP *)jacobians[9].Z.words[8],(EC_SCALAR *)(cb.words + 8),&priv->ys,
             (EC_SCALAR *)(us.words + 8));
  ec_scalar_add((EC_GROUP *)jacobians[9].Z.words[8],(EC_SCALAR *)(cb.words + 8),(EC_SCALAR *)&mask,
                (EC_SCALAR *)(cb.words + 8));
  iVar1 = scalar_to_cbb(cbb,(EC_GROUP *)jacobians[9].Z.words[8],(EC_SCALAR *)(c.words + 8));
  if ((iVar1 == 0) ||
     ((iVar1 = scalar_to_cbb(cbb,(EC_GROUP *)jacobians[9].Z.words[8],(EC_SCALAR *)(vs.words + 8)),
      iVar1 == 0 ||
      (iVar1 = scalar_to_cbb(cbb,(EC_GROUP *)jacobians[9].Z.words[8],(EC_SCALAR *)(cb.words + 8)),
      iVar1 == 0)))) {
    return 0;
  }
  ec_scalar_add((EC_GROUP *)jacobians[9].Z.words[8],(EC_SCALAR *)(ub.words + 8),
                (EC_SCALAR *)(cs_mont.words + 8),(EC_SCALAR *)(uo.words + 8));
  ec_scalar_to_montgomery
            ((EC_GROUP *)jacobians[9].Z.words[8],(EC_SCALAR *)(co.words + 8),
             (EC_SCALAR *)(ub.words + 8));
  ec_scalar_mul_montgomery
            ((EC_GROUP *)jacobians[9].Z.words[8],(EC_SCALAR *)(vb.words + 8),
             (EC_SCALAR *)(yb.words + 8),(EC_SCALAR *)(co.words + 8));
  ec_scalar_add((EC_GROUP *)jacobians[9].Z.words[8],(EC_SCALAR *)(vb.words + 8),
                (EC_SCALAR *)(k1.words + 8),(EC_SCALAR *)(vb.words + 8));
  ec_scalar_mul_montgomery
            ((EC_GROUP *)jacobians[9].Z.words[8],(EC_SCALAR *)(cb_mont.words + 8),
             (EC_SCALAR *)(k0.words + 8),(EC_SCALAR *)(co.words + 8));
  ec_scalar_add((EC_GROUP *)jacobians[9].Z.words[8],(EC_SCALAR *)(cb_mont.words + 8),
                (EC_SCALAR *)(minus_co.words + 8),(EC_SCALAR *)(cb_mont.words + 8));
  ec_scalar_neg((EC_GROUP *)jacobians[9].Z.words[8],(EC_SCALAR *)(c0.words + 8),
                (EC_SCALAR *)(uo.words + 8));
  ec_scalar_select((EC_GROUP *)jacobians[9].Z.words[8],(EC_SCALAR *)(c1.words + 8),mask_00,
                   (EC_SCALAR *)(c0.words + 8),(EC_SCALAR *)(ub.words + 8));
  ec_scalar_select((EC_GROUP *)jacobians[9].Z.words[8],(EC_SCALAR *)(u1.words + 8),mask_00,
                   (EC_SCALAR *)(vo.words + 8),(EC_SCALAR *)(vb.words + 8));
  ec_scalar_select((EC_GROUP *)jacobians[9].Z.words[8],(EC_SCALAR *)(v1.words + 8),mask_00,
                   (EC_SCALAR *)(affines[9].Y.words + 8),(EC_SCALAR *)(cb_mont.words + 8));
  ec_scalar_select((EC_GROUP *)jacobians[9].Z.words[8],(EC_SCALAR *)(u0.words + 8),mask_00,
                   (EC_SCALAR *)(ub.words + 8),(EC_SCALAR *)(c0.words + 8));
  ec_scalar_select((EC_GROUP *)jacobians[9].Z.words[8],(EC_SCALAR *)(v0.words + 8),mask_00,
                   (EC_SCALAR *)(vb.words + 8),(EC_SCALAR *)(vo.words + 8));
  ec_scalar_select((EC_GROUP *)jacobians[9].Z.words[8],(EC_SCALAR *)local_2928,mask_00,
                   (EC_SCALAR *)(cb_mont.words + 8),(EC_SCALAR *)(affines[9].Y.words + 8));
  iVar1 = scalar_to_cbb(cbb,(EC_GROUP *)jacobians[9].Z.words[8],(EC_SCALAR *)(c1.words + 8));
  if ((iVar1 != 0) &&
     ((((iVar1 = scalar_to_cbb(cbb,(EC_GROUP *)jacobians[9].Z.words[8],(EC_SCALAR *)(u0.words + 8)),
        iVar1 != 0 &&
        (iVar1 = scalar_to_cbb(cbb,(EC_GROUP *)jacobians[9].Z.words[8],(EC_SCALAR *)(u1.words + 8)),
        iVar1 != 0)) &&
       (iVar1 = scalar_to_cbb(cbb,(EC_GROUP *)jacobians[9].Z.words[8],(EC_SCALAR *)(v0.words + 8)),
       iVar1 != 0)) &&
      ((iVar1 = scalar_to_cbb(cbb,(EC_GROUP *)jacobians[9].Z.words[8],(EC_SCALAR *)(v1.words + 8)),
       iVar1 != 0 &&
       (iVar1 = scalar_to_cbb(cbb,(EC_GROUP *)jacobians[9].Z.words[8],(EC_SCALAR *)local_2928),
       iVar1 != 0)))))) {
    return 1;
  }
  return 0;
}

Assistant:

static int dleq_generate(const PMBTOKEN_METHOD *method, CBB *cbb,
                         const TRUST_TOKEN_ISSUER_KEY *priv,
                         const EC_JACOBIAN *T, const EC_JACOBIAN *S,
                         const EC_JACOBIAN *W, const EC_JACOBIAN *Ws,
                         uint8_t private_metadata) {
  const EC_GROUP *group = method->group;

  // We generate a DLEQ proof for the validity token and a DLEQOR2 proof for the
  // private metadata token. To allow amortizing Jacobian-to-affine conversions,
  // we compute Ki for both proofs first.
  enum {
    idx_T,
    idx_S,
    idx_W,
    idx_Ws,
    idx_Ks0,
    idx_Ks1,
    idx_Kb0,
    idx_Kb1,
    idx_Ko0,
    idx_Ko1,
    num_idx,
  };
  EC_JACOBIAN jacobians[num_idx];

  // Setup the DLEQ proof.
  EC_SCALAR ks0, ks1;
  if (  // ks0, ks1 <- Zp
      !ec_random_nonzero_scalar(group, &ks0, kDefaultAdditionalData) ||
      !ec_random_nonzero_scalar(group, &ks1, kDefaultAdditionalData) ||
      // Ks = ks0*(G;T) + ks1*(H;S)
      !ec_point_mul_scalar_precomp(group, &jacobians[idx_Ks0],
                                   &method->g_precomp, &ks0, &method->h_precomp,
                                   &ks1, NULL, NULL) ||
      !ec_point_mul_scalar_batch(group, &jacobians[idx_Ks1], T, &ks0, S, &ks1,
                                 NULL, NULL)) {
    return 0;
  }

  // Setup the DLEQOR proof. First, select values of xb, yb (keys corresponding
  // to the private metadata value) and pubo (public key corresponding to the
  // other value) in constant time.
  BN_ULONG mask = ((BN_ULONG)0) - (private_metadata & 1);
  EC_PRECOMP pubo_precomp;
  EC_SCALAR xb, yb;
  ec_scalar_select(group, &xb, mask, &priv->x1, &priv->x0);
  ec_scalar_select(group, &yb, mask, &priv->y1, &priv->y0);
  ec_precomp_select(group, &pubo_precomp, mask, &priv->pub0_precomp,
                    &priv->pub1_precomp);

  EC_SCALAR k0, k1, minus_co, uo, vo;
  if (  // k0, k1 <- Zp
      !ec_random_nonzero_scalar(group, &k0, kDefaultAdditionalData) ||
      !ec_random_nonzero_scalar(group, &k1, kDefaultAdditionalData) ||
      // Kb = k0*(G;T) + k1*(H;S)
      !ec_point_mul_scalar_precomp(group, &jacobians[idx_Kb0],
                                   &method->g_precomp, &k0, &method->h_precomp,
                                   &k1, NULL, NULL) ||
      !ec_point_mul_scalar_batch(group, &jacobians[idx_Kb1], T, &k0, S, &k1,
                                 NULL, NULL) ||
      // co, uo, vo <- Zp
      !ec_random_nonzero_scalar(group, &minus_co, kDefaultAdditionalData) ||
      !ec_random_nonzero_scalar(group, &uo, kDefaultAdditionalData) ||
      !ec_random_nonzero_scalar(group, &vo, kDefaultAdditionalData) ||
      // Ko = uo*(G;T) + vo*(H;S) - co*(pubo;W)
      !ec_point_mul_scalar_precomp(group, &jacobians[idx_Ko0],
                                   &method->g_precomp, &uo, &method->h_precomp,
                                   &vo, &pubo_precomp, &minus_co) ||
      !ec_point_mul_scalar_batch(group, &jacobians[idx_Ko1], T, &uo, S, &vo, W,
                                 &minus_co)) {
    return 0;
  }

  EC_AFFINE affines[num_idx];
  jacobians[idx_T] = *T;
  jacobians[idx_S] = *S;
  jacobians[idx_W] = *W;
  jacobians[idx_Ws] = *Ws;
  if (!ec_jacobian_to_affine_batch(group, affines, jacobians, num_idx)) {
    return 0;
  }

  // Select the K corresponding to K0 and K1 in constant-time.
  EC_AFFINE K00, K01, K10, K11;
  ec_affine_select(group, &K00, mask, &affines[idx_Ko0], &affines[idx_Kb0]);
  ec_affine_select(group, &K01, mask, &affines[idx_Ko1], &affines[idx_Kb1]);
  ec_affine_select(group, &K10, mask, &affines[idx_Kb0], &affines[idx_Ko0]);
  ec_affine_select(group, &K11, mask, &affines[idx_Kb1], &affines[idx_Ko1]);

  // Compute c = Hc(...) for the two proofs.
  EC_SCALAR cs, c;
  if (!hash_c_dleq(method, &cs, &priv->pubs, &affines[idx_T], &affines[idx_S],
                   &affines[idx_Ws], &affines[idx_Ks0], &affines[idx_Ks1]) ||
      !hash_c_dleqor(method, &c, &priv->pub0, &priv->pub1, &affines[idx_T],
                     &affines[idx_S], &affines[idx_W], &K00, &K01, &K10,
                     &K11)) {
    return 0;
  }

  // Compute cb, ub, and ub for the two proofs. In each of these products, only
  // one operand is in Montgomery form, so the product does not need to be
  // converted.

  EC_SCALAR cs_mont;
  ec_scalar_to_montgomery(group, &cs_mont, &cs);

  // us = ks0 + cs*xs
  EC_SCALAR us, vs;
  ec_scalar_mul_montgomery(group, &us, &priv->xs, &cs_mont);
  ec_scalar_add(group, &us, &ks0, &us);

  // vs = ks1 + cs*ys
  ec_scalar_mul_montgomery(group, &vs, &priv->ys, &cs_mont);
  ec_scalar_add(group, &vs, &ks1, &vs);

  // Store DLEQ2 proof in transcript.
  if (!scalar_to_cbb(cbb, group, &cs) || !scalar_to_cbb(cbb, group, &us) ||
      !scalar_to_cbb(cbb, group, &vs)) {
    return 0;
  }

  // cb = c - co
  EC_SCALAR cb, ub, vb;
  ec_scalar_add(group, &cb, &c, &minus_co);

  EC_SCALAR cb_mont;
  ec_scalar_to_montgomery(group, &cb_mont, &cb);

  // ub = k0 + cb*xb
  ec_scalar_mul_montgomery(group, &ub, &xb, &cb_mont);
  ec_scalar_add(group, &ub, &k0, &ub);

  // vb = k1 + cb*yb
  ec_scalar_mul_montgomery(group, &vb, &yb, &cb_mont);
  ec_scalar_add(group, &vb, &k1, &vb);

  // Select c, u, v in constant-time.
  EC_SCALAR co, c0, c1, u0, u1, v0, v1;
  ec_scalar_neg(group, &co, &minus_co);
  ec_scalar_select(group, &c0, mask, &co, &cb);
  ec_scalar_select(group, &u0, mask, &uo, &ub);
  ec_scalar_select(group, &v0, mask, &vo, &vb);
  ec_scalar_select(group, &c1, mask, &cb, &co);
  ec_scalar_select(group, &u1, mask, &ub, &uo);
  ec_scalar_select(group, &v1, mask, &vb, &vo);

  // Store DLEQOR2 proof in transcript.
  if (!scalar_to_cbb(cbb, group, &c0) || !scalar_to_cbb(cbb, group, &c1) ||
      !scalar_to_cbb(cbb, group, &u0) || !scalar_to_cbb(cbb, group, &u1) ||
      !scalar_to_cbb(cbb, group, &v0) || !scalar_to_cbb(cbb, group, &v1)) {
    return 0;
  }

  return 1;
}